

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_CheckInventory(FParser *this)

{
  AActor *activator;
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *type;
  
  bVar1 = CheckArgs(this,2);
  if (bVar1) {
    uVar2 = T_GetPlayerNum(this->t_argv);
    if (uVar2 == 0xffffffff) {
      iVar3 = 0;
    }
    else {
      (this->t_return).type = 1;
      activator = (AActor *)(&players)[(ulong)uVar2 * 0x54];
      type = stringvalue(this->t_argv + 1);
      iVar3 = FS_CheckInventory(activator,type);
    }
    (this->t_return).value.i = iVar3;
  }
  return;
}

Assistant:

void FParser::SF_CheckInventory(void)
{
	int  playernum;
	
	if (CheckArgs(2))
	{
		playernum=T_GetPlayerNum(t_argv[0]);
		if (playernum==-1) 
		{
			t_return.value.i = 0;
			return;
		}
		t_return.type = svt_int;
		t_return.value.i = FS_CheckInventory(players[playernum].mo, stringvalue(t_argv[1]));
	}
}